

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fDepthRangeTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::DepthRangeCompareCase::DepthRangeCompareCase
          (DepthRangeCompareCase *this,Context *context,char *name,char *desc,Vec4 *depthCoord,
          float zNear,float zFar,deUint32 compareFunc)

{
  TestCase::TestCase(&this->super_TestCase,context,name,desc);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__DepthRangeCompareCase_0071d7c8;
  tcu::Vector<float,_4>::Vector(&this->m_depthCoord,depthCoord);
  this->m_zNear = zNear;
  this->m_zFar = zFar;
  this->m_compareFunc = compareFunc;
  return;
}

Assistant:

DepthRangeCompareCase::DepthRangeCompareCase (Context& context, const char* name, const char* desc, const tcu::Vec4& depthCoord, const float zNear, const float zFar, const deUint32 compareFunc)
	: TestCase			(context, name, desc)
	, m_depthCoord		(depthCoord)
	, m_zNear			(zNear)
	, m_zFar			(zFar)
	, m_compareFunc		(compareFunc)
{
}